

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

stack<c4::yml::Parser::State,_16UL> * __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::operator=
          (stack<c4::yml::Parser::State,_16UL> *this,stack<c4::yml::Parser::State,_16UL> *that)

{
  stack<c4::yml::Parser::State,_16UL> *in_RSI;
  stack<c4::yml::Parser::State,_16UL> *in_RDI;
  stack<c4::yml::Parser::State,_16UL> *in_stack_000000b8;
  stack<c4::yml::Parser::State,_16UL> *in_stack_000000c0;
  
  _cb(in_RSI,(Callbacks *)in_RDI);
  resize(in_RSI,(size_t)in_RDI);
  _cp(in_stack_000000c0,in_stack_000000b8);
  return in_RDI;
}

Assistant:

stack& operator= (stack const& that) noexcept
    {
        _cb(that.m_callbacks);
        resize(that.m_size);
        _cp(&that);
        return *this;
    }